

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  _Storage<unsigned_int,_true> *p_Var1;
  _Storage<unsigned_int,_true> local_18 [2];
  _Storage<unsigned_int,_true> local_10 [2];
  
  local_10 = (_Storage<unsigned_int,_true>  [2])Expression::getEffectiveWidth(this->left_);
  local_18 = (_Storage<unsigned_int,_true>  [2])Expression::getEffectiveWidth(this->right_);
  if (((ulong)local_18 & 0x100000000) == 0) {
    p_Var1 = local_10;
  }
  else {
    p_Var1 = local_18;
    if (((ulong)local_10 & 0x100000000) != 0) {
      p_Var1 = local_10;
      if (local_10[0]._M_value < local_18[0]._M_value) {
        p_Var1 = local_18;
      }
    }
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_payload<unsigned_int,_true,_true,_true>)
         *(_Optional_payload<unsigned_int,_true,_true,_true> *)p_Var1;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}